

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_node *
lys_node_dup_recursion
          (lys_module *module,lys_node *parent,lys_node *node,unres_schema *unres,int shallow,
          int finalize)

{
  LYS_NODE LVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  lys_node *mod;
  int iVar5;
  char *pcVar6;
  lys_iffeature *plVar7;
  uint8_t *puVar8;
  lys_feature **pplVar9;
  lys_node *plVar10;
  lys_type *plVar11;
  lys_type *old;
  lys_module *plVar12;
  lys_tpdf **old_00;
  lys_node_leaf **pplVar13;
  lys_unique *plVar14;
  char **ppcVar15;
  lys_restr *plVar16;
  lys_when *plVar17;
  bool bVar18;
  lys_node_case *cs_orig;
  lys_node_case *cs;
  lys_node_notif *ntf;
  lys_node_inout *io;
  lys_node_rpc_action *rpc;
  lys_node_uses *uses_orig;
  lys_node_uses *uses;
  lys_node_anydata *any_orig;
  lys_node_anydata *any;
  lys_node_list *list_orig;
  lys_node_list *list;
  lys_node_leaflist *llist_orig;
  lys_node_leaflist *llist;
  lys_node_leaf *leaf_orig;
  lys_node_leaf *leaf;
  lys_node_choice *choice_orig;
  lys_node_choice *choice;
  lys_node_container *cont_orig;
  lys_node_container *cont;
  undefined8 *puStack_80;
  uint16_t flags;
  unres_list_uniq *unique_info;
  uint local_70;
  uint size2;
  uint size1;
  uint size;
  int rc;
  int j;
  int i;
  int_log_opts prev_ilo;
  ly_ctx *ctx;
  lys_node *p;
  lys_node *iter;
  lys_node *retval;
  int finalize_local;
  int shallow_local;
  unres_schema *unres_local;
  lys_node *node_local;
  lys_node *parent_local;
  lys_module *module_local;
  
  iter = (lys_node *)0x0;
  _i = module->ctx;
  cont_orig = (lys_node_container *)0x0;
  choice_orig = (lys_node_choice *)0x0;
  leaf_orig = (lys_node_leaf *)0x0;
  llist_orig = (lys_node_leaflist *)0x0;
  list_orig = (lys_node_list *)0x0;
  any_orig = (lys_node_anydata *)0x0;
  uses_orig = (lys_node_uses *)0x0;
  cs_orig = (lys_node_case *)0x0;
  LVar1 = node->nodetype;
  any = (lys_node_anydata *)node;
  list = (lys_node_list *)node;
  llist = (lys_node_leaflist *)node;
  leaf = (lys_node_leaf *)node;
  choice = (lys_node_choice *)node;
  retval._0_4_ = finalize;
  retval._4_4_ = shallow;
  _finalize_local = unres;
  unres_local = (unres_schema *)node;
  node_local = parent;
  parent_local = (lys_node *)module;
  if (LVar1 == LYS_CONTAINER) {
    cont_orig = (lys_node_container *)calloc(1,0x90);
    iter = (lys_node *)cont_orig;
  }
  else if (LVar1 == LYS_CHOICE) {
    choice_orig = (lys_node_choice *)calloc(1,0x78);
    iter = (lys_node *)choice_orig;
  }
  else if (LVar1 == LYS_LEAF) {
    leaf_orig = (lys_node_leaf *)calloc(1,0xd0);
    iter = (lys_node *)leaf_orig;
  }
  else if (LVar1 == LYS_LEAFLIST) {
    llist_orig = (lys_node_leaflist *)calloc(1,0xd8);
    iter = (lys_node *)llist_orig;
  }
  else if (LVar1 == LYS_LIST) {
    list_orig = (lys_node_list *)calloc(1,0xa8);
    iter = (lys_node *)list_orig;
  }
  else if (LVar1 == LYS_ANYXML) {
LAB_0019124b:
    any_orig = (lys_node_anydata *)calloc(1,0x80);
    iter = (lys_node *)any_orig;
  }
  else if (LVar1 == LYS_CASE) {
    cs_orig = (lys_node_case *)calloc(1,0x70);
    iter = (lys_node *)cs_orig;
  }
  else if (LVar1 == LYS_NOTIF) {
    iter = (lys_node *)calloc(1,0x80);
  }
  else if (LVar1 == LYS_RPC) {
LAB_001912bd:
    iter = (lys_node *)calloc(1,0x78);
  }
  else if ((LVar1 == LYS_INPUT) || (LVar1 == LYS_OUTPUT)) {
    iter = (lys_node *)calloc(1,0x78);
  }
  else {
    if (LVar1 != LYS_USES) {
      if (LVar1 != LYS_ACTION) {
        if (LVar1 != LYS_ANYDATA) {
          ly_log(_i,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                 ,0xc25);
          goto LAB_00192931;
        }
        goto LAB_0019124b;
      }
      goto LAB_001912bd;
    }
    uses_orig = (lys_node_uses *)calloc(1,0x88);
    iter = (lys_node *)uses_orig;
  }
  if (iter == (lys_node *)0x0) {
    ly_log(_i,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion");
    return (lys_node *)0x0;
  }
  pcVar6 = lydict_insert(_i,(char *)unres_local->item,0);
  iter->name = pcVar6;
  pcVar6 = lydict_insert(_i,(char *)unres_local->type,0);
  iter->dsc = pcVar6;
  pcVar6 = lydict_insert(_i,(char *)unres_local->str_snode,0);
  iter->ref = pcVar6;
  iter->flags = *(uint16_t *)&unres_local->module;
  iter->module = (lys_module *)parent_local;
  iter->nodetype = *(LYS_NODE *)&unres_local[1].str_snode;
  iter->prev = iter;
  iVar5 = unres_schema_find(_finalize_local,-1,&unres_local->count,UNRES_EXT);
  if (iVar5 == -1) {
    iter->ext_size = *(uint8_t *)((long)&unres_local->module + 2);
    iVar5 = lys_ext_dup(_i,(lys_module *)parent_local,*(lys_ext_instance ***)&unres_local->count,
                        *(uint8_t *)((long)&unres_local->module + 2),iter,LYEXT_PAR_NODE,&iter->ext,
                        retval._4_4_,_finalize_local);
    if (iVar5 != 0) goto LAB_00192931;
  }
  if (*(char *)((long)&unres_local->module + 3) != '\0') {
    iter->iffeature_size = *(uint8_t *)((long)&unres_local->module + 3);
    plVar7 = (lys_iffeature *)calloc((ulong)iter->iffeature_size,0x20);
    iter->iffeature = plVar7;
    if (iter->iffeature == (lys_iffeature *)0x0) {
      ly_log(_i,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion");
      goto LAB_00192931;
    }
  }
  if (retval._4_4_ == 0) {
    for (rc = 0; rc < (int)(uint)*(byte *)((long)&unres_local->module + 3); rc = rc + 1) {
      resolve_iffeature_getsizes
                ((lys_iffeature *)(unres_local[1].item + (long)rc * 4),&local_70,
                 (uint *)((long)&unique_info + 4));
      if (local_70 != 0) {
        size2 = (uint)((local_70 >> 2) + (local_70 & 3) != 0);
        puVar8 = (uint8_t *)malloc((ulong)size2);
        iter->iffeature[rc].expr = puVar8;
        if (iter->iffeature[rc].expr == (uint8_t *)0x0) {
          ly_log(_i,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion");
          goto LAB_00192931;
        }
        memcpy(iter->iffeature[rc].expr,unres_local[1].item[(long)rc * 4],(ulong)size2);
        pplVar9 = (lys_feature **)calloc((ulong)unique_info._4_4_,8);
        iter->iffeature[rc].features = pplVar9;
        if (iter->iffeature[rc].features == (lys_feature **)0x0) {
          ly_log(_i,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion");
          free(iter->iffeature[rc].expr);
          goto LAB_00192931;
        }
        for (size = 0; size < unique_info._4_4_; size = size + 1) {
          size1 = unres_schema_dup((lys_module *)parent_local,_finalize_local,
                                   (void *)((long)unres_local[1].item[(long)rc * 4 + 2] +
                                           (long)(int)size * 8),UNRES_IFFEAT,
                                   iter->iffeature[rc].features + (int)size);
          if (size1 == 1) {
            iter->iffeature[rc].features[(int)size] =
                 *(lys_feature **)
                  ((long)unres_local[1].item[(long)rc * 4 + 2] + (long)(int)size * 8);
          }
          else if (size1 == 0xffffffff) goto LAB_00192931;
        }
      }
      iter->iffeature[rc].ext_size = *(uint8_t *)(unres_local[1].item + (long)rc * 4 + 1);
      iVar5 = lys_ext_dup(_i,(lys_module *)parent_local,
                          (lys_ext_instance **)unres_local[1].item[(long)rc * 4 + 3],
                          *(uint8_t *)(unres_local[1].item + (long)rc * 4 + 1),iter->iffeature + rc,
                          LYEXT_PAR_IFFEATURE,&iter->iffeature[rc].ext,retval._4_4_,_finalize_local)
      ;
      if (iVar5 != 0) goto LAB_00192931;
    }
    ctx = (ly_ctx *)node_local;
    do {
      p = (lys_node *)ctx;
      while( true ) {
        bVar18 = false;
        if (p != (lys_node *)0x0) {
          bVar18 = p->nodetype == LYS_USES;
        }
        if (!bVar18) break;
        p = p->parent;
      }
      bVar18 = false;
      if ((p != (lys_node *)0x0) && (bVar18 = false, p->nodetype == LYS_AUGMENT)) {
        ctx = (ly_ctx *)p->prev;
        bVar18 = ctx != (ly_ctx *)0x0;
      }
    } while (bVar18);
    if (p == (lys_node *)0x0) {
      cont._6_2_ = 1;
    }
    else {
      cont._6_2_ = p->flags & 3;
    }
    if ((int)retval == 1) {
      if ((iter->flags & 4) == 0) {
        if (iter->nodetype != LYS_USES) {
          iter->flags = iter->flags & 0xfffc | cont._6_2_;
        }
        if ((iter->flags & 0x38) < (node_local->flags & 0x38)) {
          iter->flags = iter->flags & 0xffc7;
          iter->flags = iter->flags | node_local->flags & 0x38;
        }
      }
      else if (((cont._6_2_ & 2) != 0) && ((iter->flags & 1) != 0)) {
        ly_vlog(_i,LYE_INARG,LY_VLOG_LYS,iter,"true","config");
        ly_vlog(_i,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                "State nodes cannot have configuration nodes as children.");
        goto LAB_00192931;
      }
    }
    else if ((int)retval == 2) {
      iter->flags = iter->flags & 0xfffc;
      iter->flags = iter->flags & 0xfffb;
    }
    iVar5 = lys_node_addchild(node_local,iter->module,iter,0);
    if (iVar5 != 0) goto LAB_00192931;
    if (((ulong)unres_local[1].str_snode & 0xc) == 0) {
      for (p = *(lys_node **)&unres_local[1].count; p != (lys_node *)0x0; p = p->next) {
        if (((p->nodetype & LYS_GROUPING) == LYS_UNKNOWN) &&
           (plVar10 = lys_node_dup_recursion
                                ((lys_module *)parent_local,iter,p,_finalize_local,0,(int)retval),
           plVar10 == (lys_node *)0x0)) goto LAB_00192931;
      }
    }
    if (((((int)retval == 1) && (iter->nodetype == LYS_LIST)) && ((iter->flags & 1) != 0)) &&
       (*(char *)((long)&unres_local->module + 6) == '\0')) {
      ly_vlog(_i,LYE_MISSCHILDSTMT,LY_VLOG_LYS,iter,"key","list");
      goto LAB_00192931;
    }
  }
  else {
    memcpy(iter->iffeature,unres_local[1].item,(ulong)iter->iffeature_size << 5);
  }
  mod = parent_local;
  plVar10 = iter;
  iVar5 = *(int *)&unres_local[1].str_snode;
  if (iVar5 == 1) {
    if (choice->dflt != (lys_node *)0x0) {
      plVar17 = lys_when_dup((lys_module *)parent_local,(lys_when *)choice->dflt,retval._4_4_,
                             _finalize_local);
      cont_orig->when = plVar17;
      if (cont_orig->when == (lys_when *)0x0) goto LAB_00192931;
    }
    pcVar6 = lydict_insert(_i,choice[1].ref,0);
    cont_orig->presence = pcVar6;
    if (choice[1].name == (char *)0x0) {
      return iter;
    }
    plVar16 = lys_restr_dup((lys_module *)parent_local,(lys_restr *)choice[1].name,
                            (uint)choice->padding[1],retval._4_4_,_finalize_local);
    cont_orig->must = plVar16;
    if (cont_orig->must != (lys_restr *)0x0) {
      cont_orig->must_size = choice->padding[1];
      return iter;
    }
    goto LAB_00192931;
  }
  if (iVar5 == 2) {
    lVar2._0_1_ = leaf->hash[0];
    lVar2._1_1_ = leaf->hash[1];
    lVar2._2_1_ = leaf->hash[2];
    lVar2._3_1_ = leaf->hash[3];
    lVar2._4_4_ = *(undefined4 *)&leaf->field_0x6c;
    if (lVar2 != 0) {
      plVar17 = lys_when_dup((lys_module *)parent_local,*(lys_when **)leaf->hash,retval._4_4_,
                             _finalize_local);
      choice_orig->when = plVar17;
      if (choice_orig->when == (lys_when *)0x0) goto LAB_00192931;
    }
    if (retval._4_4_ != 0) {
      choice_orig->dflt = (lys_node *)leaf->when;
      return iter;
    }
    if (leaf->when == (lys_when *)0x0) {
      unres_schema_dup((lys_module *)parent_local,_finalize_local,leaf,UNRES_CHOICE_DFLT,choice_orig
                      );
      return iter;
    }
    plVar10 = choice_orig->child;
    plVar12 = lys_node_module(iter);
    size1 = lys_get_sibling(plVar10,plVar12->name,0,leaf->when->cond,0,0x807d,&choice_orig->dflt);
    if (size1 == 0) {
      return iter;
    }
    if (size1 == 1) {
      ly_log(_i,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
             ,0xcda);
    }
    goto LAB_00192931;
  }
  if (iVar5 == 4) {
    plVar11 = &leaf_orig->type;
    old = &llist->type;
    iVar5 = lys_ingrouping(iter);
    iVar5 = lys_type_dup((lys_module *)mod,plVar10,plVar11,old,iVar5,retval._4_4_,_finalize_local);
    if (iVar5 != 0) goto LAB_00192931;
    pcVar6 = lydict_insert((ly_ctx *)parent_local->name,llist->units,0);
    leaf_orig->units = pcVar6;
    if (llist->dflt != (char **)0x0) {
      ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,(int_log_opts *)&j,(ly_err_item **)0x0);
      plVar12 = lys_main_module(llist->module);
      pcVar6 = transform_schema2json(plVar12,(char *)llist->dflt);
      leaf_orig->dflt = pcVar6;
      ly_ilo_restore((ly_ctx *)0x0,j,(ly_err_item *)0x0,0);
      if (leaf_orig->dflt == (char *)0x0) {
        pcVar6 = lydict_insert(_i,(char *)llist->dflt,0);
        leaf_orig->dflt = pcVar6;
      }
    }
    if (llist->must != (lys_restr *)0x0) {
      plVar16 = lys_restr_dup((lys_module *)parent_local,llist->must,(uint)llist->must_size,
                              retval._4_4_,_finalize_local);
      leaf_orig->must = plVar16;
      if (leaf_orig->must == (lys_restr *)0x0) goto LAB_00192931;
      leaf_orig->must_size = llist->must_size;
    }
    if (llist->when == (lys_when *)0x0) {
      return iter;
    }
    plVar17 = lys_when_dup((lys_module *)parent_local,llist->when,retval._4_4_,_finalize_local);
    leaf_orig->when = plVar17;
    plVar17 = leaf_orig->when;
  }
  else {
    if (iVar5 == 8) {
      plVar11 = &llist_orig->type;
      old_00 = &list->tpdf;
      iVar5 = lys_ingrouping(iter);
      iVar5 = lys_type_dup((lys_module *)mod,plVar10,plVar11,(lys_type *)old_00,iVar5,retval._4_4_,
                           _finalize_local);
      if (iVar5 == 0) {
        pcVar6 = lydict_insert((ly_ctx *)parent_local->name,*(char **)&list[1].flags,0);
        llist_orig->units = pcVar6;
        llist_orig->min = *(uint32_t *)&list[1].iffeature;
        llist_orig->max = *(uint32_t *)((long)&list[1].iffeature + 4);
        if (list->must != (lys_restr *)0x0) {
          plVar16 = lys_restr_dup((lys_module *)parent_local,list->must,(uint)list->unique_size,
                                  retval._4_4_,_finalize_local);
          llist_orig->must = plVar16;
          if (llist_orig->must == (lys_restr *)0x0) goto LAB_00192931;
          llist_orig->must_size = list->unique_size;
        }
        if (list[1].ext != (lys_ext_instance **)0x0) {
          ppcVar15 = (char **)malloc((ulong)list->keys_size << 3);
          llist_orig->dflt = ppcVar15;
          if (llist_orig->dflt == (char **)0x0) {
            ly_log(_i,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion");
            goto LAB_00192931;
          }
          llist_orig->dflt_size = list->keys_size;
          for (rc = 0; rc < (int)(uint)llist_orig->dflt_size; rc = rc + 1) {
            pcVar6 = lydict_insert(_i,(char *)list[1].ext[rc],0);
            llist_orig->dflt[rc] = pcVar6;
          }
        }
        if (list->when == (lys_when *)0x0) {
          return iter;
        }
        plVar17 = lys_when_dup((lys_module *)parent_local,list->when,retval._4_4_,_finalize_local);
        llist_orig->when = plVar17;
        return iter;
      }
      goto LAB_00192931;
    }
    if (iVar5 == 0x10) {
      list_orig->min = *(uint32_t *)&any[1].flags;
      list_orig->max = *(uint32_t *)any[1].padding;
      if (any->must != (lys_restr *)0x0) {
        plVar16 = lys_restr_dup((lys_module *)parent_local,any->must,(uint)any->padding[0],
                                retval._4_4_,_finalize_local);
        list_orig->must = plVar16;
        if (list_orig->must == (lys_restr *)0x0) goto LAB_00192931;
        list_orig->must_size = any->padding[0];
      }
      if (any->padding[2] != '\0') {
        pplVar13 = (lys_node_leaf **)calloc((ulong)any->padding[2],8);
        list_orig->keys = pplVar13;
        if (list_orig->keys == (lys_node_leaf **)0x0) {
          ly_log(_i,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion");
          goto LAB_00192931;
        }
        pcVar6 = lydict_insert(_i,(char *)any[1].ext,0);
        list_orig->keys_str = pcVar6;
        list_orig->keys_size = any->padding[2];
        if (retval._4_4_ == 0) {
          iVar5 = unres_schema_add_node
                            ((lys_module *)parent_local,_finalize_local,list_orig,UNRES_LIST_KEYS,
                             (lys_node *)0x0);
          if (iVar5 == -1) goto LAB_00192931;
        }
        else {
          memcpy(list_orig->keys,any[1].dsc,(ulong)any->padding[2] << 3);
        }
      }
      if (any[1].ref != (char *)0x0) {
        plVar14 = (lys_unique *)malloc((ulong)any->must_size << 4);
        list_orig->unique = plVar14;
        if (list_orig->unique == (lys_unique *)0x0) {
          ly_log(_i,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion");
          goto LAB_00192931;
        }
        list_orig->unique_size = any->must_size;
        for (rc = 0; rc < (int)(uint)list_orig->unique_size; rc = rc + 1) {
          ppcVar15 = (char **)malloc((ulong)(byte)any[1].ref[(long)rc * 0x10 + 8] << 3);
          list_orig->unique[rc].expr = ppcVar15;
          if (list_orig->unique[rc].expr == (char **)0x0) {
            ly_log(_i,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion");
            goto LAB_00192931;
          }
          list_orig->unique[rc].expr_size = any[1].ref[(long)rc * 0x10 + 8];
          for (size = 0; (int)size < (int)(uint)list_orig->unique[rc].expr_size; size = size + 1) {
            pcVar6 = lydict_insert(_i,*(char **)(*(long *)(any[1].ref + (long)rc * 0x10) +
                                                (long)(int)size * 8),0);
            list_orig->unique[rc].expr[(int)size] = pcVar6;
            puStack_80 = (undefined8 *)malloc(0x18);
            if (puStack_80 == (undefined8 *)0x0) {
              ly_log(_i,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion"
                    );
              goto LAB_00192931;
            }
            *puStack_80 = list_orig;
            puStack_80[1] = list_orig->unique[rc].expr[(int)size];
            puStack_80[2] = &list_orig->unique[rc].trg_type;
            unres_schema_dup((lys_module *)parent_local,_finalize_local,&any,UNRES_LIST_UNIQ,
                             puStack_80);
          }
        }
      }
      if (any->when == (lys_when *)0x0) {
        return iter;
      }
      plVar17 = lys_when_dup((lys_module *)parent_local,any->when,retval._4_4_,_finalize_local);
      list_orig->when = plVar17;
      plVar17 = list_orig->when;
    }
    else if (iVar5 == 0x20) {
LAB_0019278e:
      if (node[1].dsc != (char *)0x0) {
        plVar16 = lys_restr_dup((lys_module *)parent_local,(lys_restr *)node[1].dsc,
                                (uint)node->padding[3],retval._4_4_,_finalize_local);
        any_orig->must = plVar16;
        if (any_orig->must == (lys_restr *)0x0) goto LAB_00192931;
        any_orig->must_size = node->padding[3];
      }
      if (node[1].name == (char *)0x0) {
        return iter;
      }
      plVar17 = lys_when_dup((lys_module *)parent_local,(lys_when *)node[1].name,retval._4_4_,
                             _finalize_local);
      any_orig->when = plVar17;
      plVar17 = any_orig->when;
    }
    else if (iVar5 == 0x40) {
      lVar4._0_1_ = node->hash[0];
      lVar4._1_1_ = node->hash[1];
      lVar4._2_1_ = node->hash[2];
      lVar4._3_1_ = node->hash[3];
      lVar4._4_4_ = *(undefined4 *)&node->field_0x6c;
      if (lVar4 == 0) {
        return iter;
      }
      plVar17 = lys_when_dup((lys_module *)parent_local,*(lys_when **)node->hash,retval._4_4_,
                             _finalize_local);
      cs_orig->when = plVar17;
      plVar17 = cs_orig->when;
    }
    else {
      if (iVar5 == 0x80) {
        return iter;
      }
      if (iVar5 == 0x100) {
        return iter;
      }
      if (iVar5 == 0x200) {
        return iter;
      }
      if (iVar5 == 0x400) {
        return iter;
      }
      if (iVar5 != 0x1000) {
        if (iVar5 == 0x4000) {
          return iter;
        }
        if (iVar5 != 0x8020) {
          ly_log(_i,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                 ,0xd86);
          goto LAB_00192931;
        }
        goto LAB_0019278e;
      }
      uses_orig->grp = (lys_node_grp *)node[1].ref;
      lVar3._0_1_ = node->hash[0];
      lVar3._1_1_ = node->hash[1];
      lVar3._2_1_ = node->hash[2];
      lVar3._3_1_ = node->hash[3];
      lVar3._4_4_ = *(undefined4 *)&node->field_0x6c;
      if (lVar3 == 0) {
        return iter;
      }
      plVar17 = lys_when_dup((lys_module *)parent_local,*(lys_when **)node->hash,retval._4_4_,
                             _finalize_local);
      uses_orig->when = plVar17;
      plVar17 = uses_orig->when;
    }
  }
  if (plVar17 != (lys_when *)0x0) {
    return iter;
  }
LAB_00192931:
  lys_node_free(iter,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
  return (lys_node *)0x0;
}

Assistant:

static struct lys_node *
lys_node_dup_recursion(struct lys_module *module, struct lys_node *parent, const struct lys_node *node,
                       struct unres_schema *unres, int shallow, int finalize)
{
    struct lys_node *retval = NULL, *iter, *p;
    struct ly_ctx *ctx = module->ctx;
    enum int_log_opts prev_ilo;
    int i, j, rc;
    unsigned int size, size1, size2;
    struct unres_list_uniq *unique_info;
    uint16_t flags;

    struct lys_node_container *cont = NULL;
    struct lys_node_container *cont_orig = (struct lys_node_container *)node;
    struct lys_node_choice *choice = NULL;
    struct lys_node_choice *choice_orig = (struct lys_node_choice *)node;
    struct lys_node_leaf *leaf = NULL;
    struct lys_node_leaf *leaf_orig = (struct lys_node_leaf *)node;
    struct lys_node_leaflist *llist = NULL;
    struct lys_node_leaflist *llist_orig = (struct lys_node_leaflist *)node;
    struct lys_node_list *list = NULL;
    struct lys_node_list *list_orig = (struct lys_node_list *)node;
    struct lys_node_anydata *any = NULL;
    struct lys_node_anydata *any_orig = (struct lys_node_anydata *)node;
    struct lys_node_uses *uses = NULL;
    struct lys_node_uses *uses_orig = (struct lys_node_uses *)node;
    struct lys_node_rpc_action *rpc = NULL;
    struct lys_node_inout *io = NULL;
    struct lys_node_notif *ntf = NULL;
    struct lys_node_case *cs = NULL;
    struct lys_node_case *cs_orig = (struct lys_node_case *)node;

    /* we cannot just duplicate memory since the strings are stored in
     * dictionary and we need to update dictionary counters.
     */

    switch (node->nodetype) {
    case LYS_CONTAINER:
        cont = calloc(1, sizeof *cont);
        retval = (struct lys_node *)cont;
        break;

    case LYS_CHOICE:
        choice = calloc(1, sizeof *choice);
        retval = (struct lys_node *)choice;
        break;

    case LYS_LEAF:
        leaf = calloc(1, sizeof *leaf);
        retval = (struct lys_node *)leaf;
        break;

    case LYS_LEAFLIST:
        llist = calloc(1, sizeof *llist);
        retval = (struct lys_node *)llist;
        break;

    case LYS_LIST:
        list = calloc(1, sizeof *list);
        retval = (struct lys_node *)list;
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        any = calloc(1, sizeof *any);
        retval = (struct lys_node *)any;
        break;

    case LYS_USES:
        uses = calloc(1, sizeof *uses);
        retval = (struct lys_node *)uses;
        break;

    case LYS_CASE:
        cs = calloc(1, sizeof *cs);
        retval = (struct lys_node *)cs;
        break;

    case LYS_RPC:
    case LYS_ACTION:
        rpc = calloc(1, sizeof *rpc);
        retval = (struct lys_node *)rpc;
        break;

    case LYS_INPUT:
    case LYS_OUTPUT:
        io = calloc(1, sizeof *io);
        retval = (struct lys_node *)io;
        break;

    case LYS_NOTIF:
        ntf = calloc(1, sizeof *ntf);
        retval = (struct lys_node *)ntf;
        break;

    default:
        LOGINT(ctx);
        goto error;
    }
    LY_CHECK_ERR_RETURN(!retval, LOGMEM(ctx), NULL);

    /*
     * duplicate generic part of the structure
     */
    retval->name = lydict_insert(ctx, node->name, 0);
    retval->dsc = lydict_insert(ctx, node->dsc, 0);
    retval->ref = lydict_insert(ctx, node->ref, 0);
    retval->flags = node->flags;

    retval->module = module;
    retval->nodetype = node->nodetype;

    retval->prev = retval;

    /* copying unresolved extensions is not supported */
    if (unres_schema_find(unres, -1, (void *)&node->ext, UNRES_EXT) == -1) {
        retval->ext_size = node->ext_size;
        if (lys_ext_dup(ctx, module, node->ext, node->ext_size, retval, LYEXT_PAR_NODE, &retval->ext, shallow, unres)) {
            goto error;
        }
    }

    if (node->iffeature_size) {
        retval->iffeature_size = node->iffeature_size;
        retval->iffeature = calloc(retval->iffeature_size, sizeof *retval->iffeature);
        LY_CHECK_ERR_GOTO(!retval->iffeature, LOGMEM(ctx), error);
    }

    if (!shallow) {
        for (i = 0; i < node->iffeature_size; ++i) {
            resolve_iffeature_getsizes(&node->iffeature[i], &size1, &size2);
            if (size1) {
                /* there is something to duplicate */

                /* duplicate compiled expression */
                size = (size1 / 4) + (size1 % 4) ? 1 : 0;
                retval->iffeature[i].expr = malloc(size * sizeof *retval->iffeature[i].expr);
                LY_CHECK_ERR_GOTO(!retval->iffeature[i].expr, LOGMEM(ctx), error);
                memcpy(retval->iffeature[i].expr, node->iffeature[i].expr, size * sizeof *retval->iffeature[i].expr);

                /* list of feature pointer must be updated to point to the resulting tree */
                retval->iffeature[i].features = calloc(size2, sizeof *retval->iffeature[i].features);
                LY_CHECK_ERR_GOTO(!retval->iffeature[i].features, LOGMEM(ctx); free(retval->iffeature[i].expr), error);

                for (j = 0; (unsigned int)j < size2; j++) {
                    rc = unres_schema_dup(module, unres, &node->iffeature[i].features[j], UNRES_IFFEAT,
                                          &retval->iffeature[i].features[j]);
                    if (rc == EXIT_FAILURE) {
                        /* feature is resolved in origin, so copy it
                         * - duplication is used for instantiating groupings
                         * and if-feature inside grouping is supposed to be
                         * resolved inside the original grouping, so we want
                         * to keep pointers to features from the grouping
                         * context */
                        retval->iffeature[i].features[j] = node->iffeature[i].features[j];
                    } else if (rc == -1) {
                        goto error;
                    } /* else unres was duplicated */
                }
            }

            /* duplicate if-feature's extensions */
            retval->iffeature[i].ext_size = node->iffeature[i].ext_size;
            if (lys_ext_dup(ctx, module, node->iffeature[i].ext, node->iffeature[i].ext_size,
                            &retval->iffeature[i], LYEXT_PAR_IFFEATURE, &retval->iffeature[i].ext, shallow, unres)) {
                goto error;
            }
        }

        /* inherit config flags */
        p = parent;
        do {
            for (iter = p; iter && (iter->nodetype == LYS_USES); iter = iter->parent);
        } while (iter && iter->nodetype == LYS_AUGMENT && (p = ((struct lys_node_augment *)iter)->target));
        if (iter) {
            flags = iter->flags & LYS_CONFIG_MASK;
        } else {
            /* default */
            flags = LYS_CONFIG_W;
        }

        switch (finalize) {
        case 1:
            /* inherit config flags */
            if (retval->flags & LYS_CONFIG_SET) {
                /* skip nodes with an explicit config value */
                if ((flags & LYS_CONFIG_R) && (retval->flags & LYS_CONFIG_W)) {
                    LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, retval, "true", "config");
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
                    goto error;
                }
                break;
            }

            if (retval->nodetype != LYS_USES) {
                retval->flags = (retval->flags & ~LYS_CONFIG_MASK) | flags;
            }

            /* inherit status */
            if ((parent->flags & LYS_STATUS_MASK) > (retval->flags & LYS_STATUS_MASK)) {
                /* but do it only in case the parent has a stonger status */
                retval->flags &= ~LYS_STATUS_MASK;
                retval->flags |= (parent->flags & LYS_STATUS_MASK);
            }
            break;
        case 2:
            /* erase config flags */
            retval->flags &= ~LYS_CONFIG_MASK;
            retval->flags &= ~LYS_CONFIG_SET;
            break;
        }

        /* connect it to the parent */
        if (lys_node_addchild(parent, retval->module, retval, 0)) {
            goto error;
        }

        /* go recursively */
        if (!(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LY_TREE_FOR(node->child, iter) {
                if (iter->nodetype & LYS_GROUPING) {
                    /* do not instantiate groupings */
                    continue;
                }
                if (!lys_node_dup_recursion(module, retval, iter, unres, 0, finalize)) {
                    goto error;
                }
            }
        }

        if (finalize == 1) {
            /* check that configuration lists have keys
             * - we really want to check keys_size in original node, because the keys are
             * not yet resolved here, it is done below in nodetype specific part */
            if ((retval->nodetype == LYS_LIST) && (retval->flags & LYS_CONFIG_W)
                    && !((struct lys_node_list *)node)->keys_size) {
                LOGVAL(ctx, LYE_MISSCHILDSTMT, LY_VLOG_LYS, retval, "key", "list");
                goto error;
            }
        }
    } else {
        memcpy(retval->iffeature, node->iffeature, retval->iffeature_size * sizeof *retval->iffeature);
    }

    /*
     * duplicate specific part of the structure
     */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        if (cont_orig->when) {
            cont->when = lys_when_dup(module, cont_orig->when, shallow, unres);
            LY_CHECK_GOTO(!cont->when, error);
        }
        cont->presence = lydict_insert(ctx, cont_orig->presence, 0);

        if (cont_orig->must) {
            cont->must = lys_restr_dup(module, cont_orig->must, cont_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!cont->must, error);
            cont->must_size = cont_orig->must_size;
        }

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        break;
    case LYS_CHOICE:
        if (choice_orig->when) {
            choice->when = lys_when_dup(module, choice_orig->when, shallow, unres);
            LY_CHECK_GOTO(!choice->when, error);
        }

        if (!shallow) {
            if (choice_orig->dflt) {
                rc = lys_get_sibling(choice->child, lys_node_module(retval)->name, 0, choice_orig->dflt->name, 0,
                                            LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST,
                                            (const struct lys_node **)&choice->dflt);
                if (rc) {
                    if (rc == EXIT_FAILURE) {
                        LOGINT(ctx);
                    }
                    goto error;
                }
            } else {
                /* useless to check return value, we don't know whether
                * there really wasn't any default defined or it just hasn't
                * been resolved, we just hope for the best :)
                */
                unres_schema_dup(module, unres, choice_orig, UNRES_CHOICE_DFLT, choice);
            }
        } else {
            choice->dflt = choice_orig->dflt;
        }
        break;

    case LYS_LEAF:
        if (lys_type_dup(module, retval, &(leaf->type), &(leaf_orig->type), lys_ingrouping(retval), shallow, unres)) {
            goto error;
        }
        leaf->units = lydict_insert(module->ctx, leaf_orig->units, 0);

        if (leaf_orig->dflt) {
            /* transform into JSON format, may not be possible later */
            ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, NULL);
            leaf->dflt = transform_schema2json(lys_main_module(leaf_orig->module), leaf_orig->dflt);
            ly_ilo_restore(NULL, prev_ilo, NULL, 0);
            if (!leaf->dflt) {
                /* invalid identityref format or it was already transformed, so ignore the error here */
                leaf->dflt = lydict_insert(ctx, leaf_orig->dflt, 0);
            }
        }

        if (leaf_orig->must) {
            leaf->must = lys_restr_dup(module, leaf_orig->must, leaf_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!leaf->must, error);
            leaf->must_size = leaf_orig->must_size;
        }

        if (leaf_orig->when) {
            leaf->when = lys_when_dup(module, leaf_orig->when, shallow, unres);
            LY_CHECK_GOTO(!leaf->when, error);
        }
        break;

    case LYS_LEAFLIST:
        if (lys_type_dup(module, retval, &(llist->type), &(llist_orig->type), lys_ingrouping(retval), shallow, unres)) {
            goto error;
        }
        llist->units = lydict_insert(module->ctx, llist_orig->units, 0);

        llist->min = llist_orig->min;
        llist->max = llist_orig->max;

        if (llist_orig->must) {
            llist->must = lys_restr_dup(module, llist_orig->must, llist_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!llist->must, error);
            llist->must_size = llist_orig->must_size;
        }

        if (llist_orig->dflt) {
            llist->dflt = malloc(llist_orig->dflt_size * sizeof *llist->dflt);
            LY_CHECK_ERR_GOTO(!llist->dflt, LOGMEM(ctx), error);
            llist->dflt_size = llist_orig->dflt_size;

            for (i = 0; i < llist->dflt_size; i++) {
                llist->dflt[i] = lydict_insert(ctx, llist_orig->dflt[i], 0);
            }
        }

        if (llist_orig->when) {
            llist->when = lys_when_dup(module, llist_orig->when, shallow, unres);
        }
        break;

    case LYS_LIST:
        list->min = list_orig->min;
        list->max = list_orig->max;

        if (list_orig->must) {
            list->must = lys_restr_dup(module, list_orig->must, list_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!list->must, error);
            list->must_size = list_orig->must_size;
        }

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        if (list_orig->keys_size) {
            list->keys = calloc(list_orig->keys_size, sizeof *list->keys);
            LY_CHECK_ERR_GOTO(!list->keys, LOGMEM(ctx), error);
            list->keys_str = lydict_insert(ctx, list_orig->keys_str, 0);
            list->keys_size = list_orig->keys_size;

            if (!shallow) {
                if (unres_schema_add_node(module, unres, list, UNRES_LIST_KEYS, NULL) == -1) {
                    goto error;
                }
            } else {
                memcpy(list->keys, list_orig->keys, list_orig->keys_size * sizeof *list->keys);
            }
        }

        if (list_orig->unique) {
            list->unique = malloc(list_orig->unique_size * sizeof *list->unique);
            LY_CHECK_ERR_GOTO(!list->unique, LOGMEM(ctx), error);
            list->unique_size = list_orig->unique_size;

            for (i = 0; i < list->unique_size; ++i) {
                list->unique[i].expr = malloc(list_orig->unique[i].expr_size * sizeof *list->unique[i].expr);
                LY_CHECK_ERR_GOTO(!list->unique[i].expr, LOGMEM(ctx), error);
                list->unique[i].expr_size = list_orig->unique[i].expr_size;
                for (j = 0; j < list->unique[i].expr_size; j++) {
                    list->unique[i].expr[j] = lydict_insert(ctx, list_orig->unique[i].expr[j], 0);

                    /* if it stays in unres list, duplicate it also there */
                    unique_info = malloc(sizeof *unique_info);
                    LY_CHECK_ERR_GOTO(!unique_info, LOGMEM(ctx), error);
                    unique_info->list = (struct lys_node *)list;
                    unique_info->expr = list->unique[i].expr[j];
                    unique_info->trg_type = &list->unique[i].trg_type;
                    unres_schema_dup(module, unres, &list_orig, UNRES_LIST_UNIQ, unique_info);
                }
            }
        }

        if (list_orig->when) {
            list->when = lys_when_dup(module, list_orig->when, shallow, unres);
            LY_CHECK_GOTO(!list->when, error);
        }
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        if (any_orig->must) {
            any->must = lys_restr_dup(module, any_orig->must, any_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!any->must, error);
            any->must_size = any_orig->must_size;
        }

        if (any_orig->when) {
            any->when = lys_when_dup(module, any_orig->when, shallow, unres);
            LY_CHECK_GOTO(!any->when, error);
        }
        break;

    case LYS_USES:
        uses->grp = uses_orig->grp;

        if (uses_orig->when) {
            uses->when = lys_when_dup(module, uses_orig->when, shallow, unres);
            LY_CHECK_GOTO(!uses->when, error);
        }
        /* it is not needed to duplicate refine, nor augment. They are already applied to the uses children */
        break;

    case LYS_CASE:
        if (cs_orig->when) {
            cs->when = lys_when_dup(module, cs_orig->when, shallow, unres);
            LY_CHECK_GOTO(!cs->when, error);
        }
        break;

    case LYS_ACTION:
    case LYS_RPC:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */
        break;

    default:
        /* LY_NODE_AUGMENT */
        LOGINT(ctx);
        goto error;
    }

    return retval;

error:
    lys_node_free(retval, NULL, 0);
    return NULL;
}